

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall ncnn::ModelBinFromDataReader::load(ModelBinFromDataReader *this,int w,int type)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  unsigned_short *puVar4;
  char *pcVar5;
  void *pvVar6;
  uchar *puVar7;
  byte *pbVar8;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  Mat *in_RDI;
  int nread_1;
  Mat m_3;
  int i;
  float *ptr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> index_array;
  int align_weight_data_size;
  float quantization_value [256];
  Mat m;
  Mat m_2;
  vector<signed_char,_std::allocator<signed_char>_> int8_weights;
  int align_data_size_1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  int align_data_size;
  uint flag;
  anon_union_4_2_77b30072 flag_struct;
  int nread;
  Mat *m_1;
  Allocator *in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a4;
  undefined8 in_stack_fffffffffffff9a8;
  int _w;
  long *plVar9;
  Mat *in_stack_fffffffffffff9b0;
  size_type in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  undefined8 in_stack_fffffffffffff9d0;
  int size;
  unsigned_short *in_stack_fffffffffffff9d8;
  Mat local_568;
  int local_524;
  float *local_520;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_518;
  uint local_4fc;
  float local_4f8 [256];
  Mat local_f8;
  Mat local_b8;
  undefined1 local_71;
  uint local_54;
  int local_50;
  uint local_28;
  int local_24;
  uint local_20;
  uint local_1c;
  int local_14;
  
  size = (int)((ulong)in_stack_fffffffffffff9d0 >> 0x20);
  _w = (int)((ulong)in_stack_fffffffffffff9a8 >> 0x20);
  local_14 = in_EDX;
  if (in_ECX != 0) {
    if (in_ECX == 1) {
      Mat::Mat(in_stack_fffffffffffff9b0,_w,
               CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
               in_stack_fffffffffffff998);
      bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
      if (bVar1) {
        Mat::Mat(in_RDI,&local_568);
      }
      else {
        plVar9 = *(long **)(in_RSI + 8);
        pvVar6 = Mat::operator_cast_to_void_(&local_568);
        uVar2 = (**(code **)(*plVar9 + 0x18))(plVar9,pvVar6,local_14 << 2);
        if (uVar2 == local_14 << 2) {
          Mat::Mat(in_RDI,&local_568);
        }
        else {
          fprintf(_stderr,"ModelBin read weight_data failed %d\n",(ulong)uVar2);
          Mat::Mat(in_RDI);
        }
      }
      local_50 = 1;
      Mat::~Mat((Mat *)0x12bfd3);
      return in_RDI;
    }
    fprintf(_stderr,"ModelBin load type %d not implemented\n",(ulong)in_ECX);
    Mat::Mat(in_RDI);
    return in_RDI;
  }
  local_1c = (**(code **)(**(long **)(in_RSI + 8) + 0x18))(*(long **)(in_RSI + 8),&local_20,4);
  if (local_1c != 4) {
    fprintf(_stderr,"ModelBin read flag_struct failed %d\n",(ulong)local_1c);
    Mat::Mat(in_RDI);
    return in_RDI;
  }
  local_24 = (local_20 & 0xff) + (local_20 >> 8 & 0xff) + (local_20 >> 0x10 & 0xff) +
             (local_20 >> 0x18);
  if (local_20 == 0x1306b47) {
    sVar3 = ncnn::alignSize((long)local_14 * 2,4);
    local_28 = (uint)sVar3;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x12b5e6);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               in_stack_fffffffffffff9b8);
    plVar9 = *(long **)(in_RSI + 8);
    puVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x12b61e);
    local_1c = (**(code **)(*plVar9 + 0x18))(plVar9,puVar4,local_28);
    if (local_1c == local_28) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x12b6ce);
      Mat::from_float16(in_stack_fffffffffffff9d8,size);
    }
    else {
      fprintf(_stderr,"ModelBin read float16_weights failed %d\n",(ulong)local_1c);
      Mat::Mat(in_RDI);
    }
    local_50 = 1;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffff9b0)
    ;
    return in_RDI;
  }
  if (local_20 == 0xd4b38) {
    sVar3 = ncnn::alignSize((long)local_14,4);
    local_54 = (uint)sVar3;
    std::vector<signed_char,_std::allocator<signed_char>_>::vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)0x12b743);
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              ((vector<signed_char,_std::allocator<signed_char>_> *)
               CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               in_stack_fffffffffffff9b8);
    plVar9 = *(long **)(in_RSI + 8);
    pcVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                       ((vector<signed_char,_std::allocator<signed_char>_> *)0x12b77b);
    local_1c = (**(code **)(*plVar9 + 0x18))(plVar9,pcVar5,local_54);
    if (local_1c == local_54) {
      local_71 = 0;
      Mat::Mat(in_stack_fffffffffffff9b0,_w,
               CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
               in_stack_fffffffffffff998);
      bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
      if (!bVar1) {
        pvVar6 = in_RDI->data;
        pcVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                           ((vector<signed_char,_std::allocator<signed_char>_> *)0x12b8b6);
        memcpy(pvVar6,pcVar5,(long)local_14);
      }
      local_71 = 1;
    }
    else {
      fprintf(_stderr,"ModelBin read int8_weights failed %d\n",(ulong)local_1c);
      Mat::Mat(in_RDI);
    }
    local_50 = 1;
    std::vector<signed_char,_std::allocator<signed_char>_>::~vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_fffffffffffff9b0);
    return in_RDI;
  }
  if (local_20 == 0x2c056) {
    Mat::Mat(in_stack_fffffffffffff9b0,_w,
             CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),in_stack_fffffffffffff998
            );
    bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
    if (bVar1) {
      Mat::Mat(in_RDI,&local_b8);
    }
    else {
      plVar9 = *(long **)(in_RSI + 8);
      pvVar6 = Mat::operator_cast_to_void_(&local_b8);
      local_1c = (**(code **)(*plVar9 + 0x18))(plVar9,pvVar6,local_14 << 2);
      if (local_1c == local_14 << 2) {
        Mat::Mat(in_RDI,&local_b8);
      }
      else {
        fprintf(_stderr,"ModelBin read weight_data failed %d\n",(ulong)local_1c);
        Mat::Mat(in_RDI);
      }
    }
    local_50 = 1;
    Mat::~Mat((Mat *)0x12baa2);
    return in_RDI;
  }
  Mat::Mat(in_stack_fffffffffffff9b0,_w,
           CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),in_stack_fffffffffffff998);
  bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0));
  if (bVar1) {
    Mat::Mat(in_RDI,&local_f8);
    local_50 = 1;
    goto LAB_0012be46;
  }
  if (local_24 == 0) {
    if ((char)local_20 == '\0') {
      plVar9 = *(long **)(in_RSI + 8);
      pvVar6 = Mat::operator_cast_to_void_(&local_f8);
      local_1c = (**(code **)(*plVar9 + 0x18))(plVar9,pvVar6,local_14 << 2);
      if (local_1c != local_14 << 2) {
        fprintf(_stderr,"ModelBin read weight_data failed %d\n",(ulong)local_1c);
        Mat::Mat(in_RDI);
        local_50 = 1;
        goto LAB_0012be46;
      }
    }
  }
  else {
    local_1c = (**(code **)(**(long **)(in_RSI + 8) + 0x18))(*(long **)(in_RSI + 8),local_4f8,0x400)
    ;
    if (local_1c != 0x400) {
      fprintf(_stderr,"ModelBin read quantization_value failed %d\n",(ulong)local_1c);
      Mat::Mat(in_RDI);
      local_50 = 1;
      goto LAB_0012be46;
    }
    sVar3 = ncnn::alignSize((long)local_14,4);
    local_4fc = (uint)sVar3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12bbea);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               in_stack_fffffffffffff9b8);
    plVar9 = *(long **)(in_RSI + 8);
    puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12bc1c);
    local_1c = (**(code **)(*plVar9 + 0x18))(plVar9,puVar7,local_4fc);
    if (local_1c == local_4fc) {
      local_520 = Mat::operator_cast_to_float_(&local_f8);
      for (local_524 = 0; local_524 < local_14; local_524 = local_524 + 1) {
        pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&local_518,(long)local_524);
        local_520[local_524] = local_4f8[*pbVar8];
      }
      local_50 = 0;
    }
    else {
      fprintf(_stderr,"ModelBin read index_array failed %d\n",(ulong)local_1c);
      Mat::Mat(in_RDI);
      local_50 = 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff9b0);
    if (local_50 != 0) goto LAB_0012be46;
  }
  Mat::Mat(in_RDI,&local_f8);
  local_50 = 1;
LAB_0012be46:
  Mat::~Mat((Mat *)0x12be53);
  return in_RDI;
}

Assistant:

Mat ModelBinFromDataReader::load(int w, int type) const
{
    if (type == 0)
    {
        int nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = dr.read(&flag_struct, sizeof(flag_struct));
        if (nread != (int)sizeof(flag_struct))
        {
            fprintf(stderr, "ModelBin read flag_struct failed %d\n", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            int align_data_size = alignSize(w * sizeof(unsigned short), 4);
            std::vector<unsigned short> float16_weights;
            float16_weights.resize(align_data_size);
            nread = dr.read(float16_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                fprintf(stderr, "ModelBin read float16_weights failed %d\n", nread);
                return Mat();
            }

            return Mat::from_float16(float16_weights.data(), w);
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            int align_data_size = alignSize(w, 4);
            std::vector<signed char> int8_weights;
            int8_weights.resize(align_data_size);
            nread = dr.read(int8_weights.data(), align_data_size);
            if (nread != align_data_size)
            {
                fprintf(stderr, "ModelBin read int8_weights failed %d\n", nread);
                return Mat();
            }

            Mat m(w, (size_t)1u);
            if (m.empty())
                return m;

            memcpy(m.data, int8_weights.data(), w);

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            Mat m(w);
            if (m.empty())
                return m;

            // raw data with extra scaling
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * (int)sizeof(float))
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }

            return m;
        }

        Mat m(w);
        if (m.empty())
            return m;

        if (flag != 0)
        {
            // quantized data
            float quantization_value[256];
            nread = dr.read(quantization_value, 256 * sizeof(float));
            if (nread != 256 * (int)sizeof(float))
            {
                fprintf(stderr, "ModelBin read quantization_value failed %d\n", nread);
                return Mat();
            }

            int align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = dr.read(index_array.data(), align_weight_data_size);
            if (nread != align_weight_data_size)
            {
                fprintf(stderr, "ModelBin read index_array failed %d\n", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            nread = dr.read(m, w * sizeof(float));
            if (nread != w * (int)sizeof(float))
            {
                fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
                return Mat();
            }
        }

        return m;
    }
    else if (type == 1)
    {
        Mat m(w);
        if (m.empty())
            return m;

        // raw data
        int nread = dr.read(m, w * sizeof(float));
        if (nread != w * (int)sizeof(float))
        {
            fprintf(stderr, "ModelBin read weight_data failed %d\n", nread);
            return Mat();
        }

        return m;
    }
    else
    {
        fprintf(stderr, "ModelBin load type %d not implemented\n", type);
        return Mat();
    }

    return Mat();
}